

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addMemberName(Builder *this,Id id,int memberNumber,char *string)

{
  Instruction *this_00;
  value_type local_30;
  Instruction *local_28;
  Instruction *name;
  char *string_local;
  int memberNumber_local;
  Id id_local;
  Builder *this_local;
  
  name = (Instruction *)string;
  string_local._0_4_ = memberNumber;
  string_local._4_4_ = id;
  _memberNumber_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,OpMemberName);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,3);
  spv::Instruction::addIdOperand(local_28,string_local._4_4_);
  spv::Instruction::addImmediateOperand(local_28,(uint)string_local);
  spv::Instruction::addStringOperand(local_28,(char *)name);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->names,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void Builder::addMemberName(Id id, int memberNumber, const char* string)
{
    Instruction* name = new Instruction(OpMemberName);
    name->reserveOperands(3);
    name->addIdOperand(id);
    name->addImmediateOperand(memberNumber);
    name->addStringOperand(string);

    names.push_back(std::unique_ptr<Instruction>(name));
}